

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderArrow(ImDrawList *draw_list,ImVec2 pos,ImU32 col,ImGuiDir dir,float scale)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar5 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImVec2 local_18;
  ImVec2 local_10;
  ImVec2 local_8;
  
  fVar4 = draw_list->_Data->FontSize;
  if ((uint)dir < 4) {
    fVar6 = fVar4 * 0.4 * scale;
    switch(dir) {
    case 0:
      auVar2._8_4_ = 0x80000000;
      auVar2._0_8_ = 0x8000000080000000;
      auVar2._12_4_ = 0x80000000;
      auVar3 = vxorps_avx512vl(ZEXT416((uint)fVar6),auVar2);
      fVar6 = auVar3._0_4_;
    case 1:
      fVar12 = fVar6 * 0.75;
      fVar13 = fVar6 * 0.0;
      fVar14 = fVar6 * 0.0;
      fVar15 = fVar6 * 0.0;
      auVar3 = vinsertps_avx(ZEXT416((uint)(fVar6 * -0.75)),ZEXT416((uint)(fVar6 * 0.866)),0x10);
      auVar11 = vinsertps_avx(ZEXT416((uint)(fVar6 * -0.75)),ZEXT416((uint)(fVar6 * -0.866)),0x10);
      break;
    case 2:
      auVar1._8_4_ = 0x80000000;
      auVar1._0_8_ = 0x8000000080000000;
      auVar1._12_4_ = 0x80000000;
      auVar3 = vxorps_avx512vl(ZEXT416((uint)fVar6),auVar1);
      fVar6 = auVar3._0_4_;
    case 3:
      auVar11._0_4_ = fVar6 * 0.866;
      auVar11._4_4_ = fVar6 * -0.75;
      auVar11._8_4_ = fVar6 * 0.0;
      auVar11._12_4_ = fVar6 * 0.0;
      fVar12 = fVar6 * 0.0;
      fVar13 = fVar6 * 0.75;
      fVar14 = fVar6 * 0.0;
      fVar15 = fVar6 * 0.0;
      auVar3._4_12_ = auVar11._4_12_;
      auVar3._0_4_ = fVar6 * -0.866;
    }
  }
  else {
    auVar11 = ZEXT816(0) << 0x40;
    auVar3 = ZEXT816(0) << 0x40;
    fVar12 = 0.0;
    fVar13 = 0.0;
    fVar14 = 0.0;
    fVar15 = 0.0;
  }
  fVar4 = fVar4 * 0.5;
  auVar1 = vinsertps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)(fVar4 * scale)),0x10);
  fVar4 = auVar1._0_4_ + pos.x;
  fVar6 = auVar1._4_4_ + pos.y;
  fVar7 = auVar1._8_4_ + in_register_00001208._0_4_;
  fVar8 = auVar1._12_4_ + in_register_00001208._4_4_;
  auVar9._0_4_ = fVar4 + fVar12;
  auVar9._4_4_ = fVar6 + fVar13;
  auVar9._8_4_ = fVar7 + fVar14;
  auVar9._12_4_ = fVar8 + fVar15;
  auVar10._0_4_ = fVar4 + auVar3._0_4_;
  auVar10._4_4_ = fVar6 + auVar3._4_4_;
  auVar10._8_4_ = fVar7 + auVar3._8_4_;
  auVar10._12_4_ = fVar8 + auVar3._12_4_;
  auVar5._0_4_ = fVar4 + auVar11._0_4_;
  auVar5._4_4_ = fVar6 + auVar11._4_4_;
  auVar5._8_4_ = fVar7 + auVar11._8_4_;
  auVar5._12_4_ = fVar8 + auVar11._12_4_;
  local_8 = (ImVec2)vmovlps_avx(auVar9);
  local_10 = (ImVec2)vmovlps_avx(auVar10);
  local_18 = (ImVec2)vmovlps_avx(auVar5);
  ImDrawList::AddTriangleFilled(draw_list,&local_8,&local_10,&local_18,col);
  return;
}

Assistant:

void ImGui::RenderArrow(ImDrawList* draw_list, ImVec2 pos, ImU32 col, ImGuiDir dir, float scale)
{
    const float h = draw_list->_Data->FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = pos + ImVec2(h * 0.50f, h * 0.50f * scale);

    ImVec2 a, b, c;
    switch (dir)
    {
    case ImGuiDir_Up:
    case ImGuiDir_Down:
        if (dir == ImGuiDir_Up) r = -r;
        a = ImVec2(+0.000f, +0.750f) * r;
        b = ImVec2(-0.866f, -0.750f) * r;
        c = ImVec2(+0.866f, -0.750f) * r;
        break;
    case ImGuiDir_Left:
    case ImGuiDir_Right:
        if (dir == ImGuiDir_Left) r = -r;
        a = ImVec2(+0.750f, +0.000f) * r;
        b = ImVec2(-0.750f, +0.866f) * r;
        c = ImVec2(-0.750f, -0.866f) * r;
        break;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }
    draw_list->AddTriangleFilled(center + a, center + b, center + c, col);
}